

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall CCamera::OnRender(CCamera *this)

{
  int iVar1;
  CGameClient *pCVar2;
  CConfig *pCVar3;
  CControls *pCVar4;
  CNetObj_PlayerInfo *pCVar5;
  float fVar6;
  vec2 vVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  vec2 vVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar15;
  float fVar16;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar17;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_28;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_24;
  
  pCVar2 = (this->super_CComponent).m_pClient;
  if (pCVar2->m_pClient->m_State - 3U < 2) {
    this->m_Zoom = 1.0;
    if ((((pCVar2->m_Snap).m_SpecInfo.m_Active == true) &&
        ((pCVar2->m_Snap).m_SpecInfo.m_UsePosition == false)) &&
       (((pCVar2->m_Snap).m_SpecInfo.m_SpecMode == 0 ||
        ((pCVar5 = (pCVar2->m_Snap).m_pLocalInfo, pCVar5 != (CNetObj_PlayerInfo *)0x0 &&
         ((pCVar5->m_PlayerFlags & 0x10) == 0)))))) {
      if (this->m_CamType != 0) {
        pCVar2->m_pControls->m_MousePos = this->m_PrevCenter;
        CControls::ClampMousePos(((this->super_CComponent).m_pClient)->m_pControls);
        this->m_CamType = 0;
      }
      this->m_Center = ((this->super_CComponent).m_pClient)->m_pControls->m_MousePos;
      goto LAB_00136479;
    }
    if (this->m_CamType != 1) {
      CControls::ClampMousePos(pCVar2->m_pControls);
      this->m_CamType = 1;
    }
    fVar16 = ((this->super_CComponent).m_pClient)->m_pClient->m_RenderFrameTime;
    if (OnRender()::s_LastMousePos == '\0') {
      OnRender();
    }
    if (OnRender()::s_CurrentCameraOffset == '\0') {
      OnRender();
    }
    pCVar2 = (this->super_CComponent).m_pClient;
    pCVar3 = pCVar2->m_pConfig;
    if (0 < pCVar3->m_ClCameraSmoothness) {
      fVar10 = ((float)pCVar3->m_ClCameraSmoothness / -100.0 + 1.0) * 9.5 + 0.5;
      OnRender::s_SpeedBias = fVar10 * fVar16 + OnRender::s_SpeedBias;
      iVar1 = pCVar3->m_ClCameraStabilizing;
      if (pCVar3->m_ClDynamicCamera == 0) {
        OnRender::s_SpeedBias = 5.0;
        if (5.0 <= fVar10) {
          OnRender::s_SpeedBias = fVar10;
        }
      }
      else {
        pCVar4 = pCVar2->m_pControls;
        fVar6 = (pCVar4->m_MousePos).field_0.x - OnRender::s_LastMousePos.field_0.x;
        fVar11 = (pCVar4->m_MousePos).field_1.y - OnRender::s_LastMousePos.field_1.y;
        fVar6 = fVar6 * fVar6 + fVar11 * fVar11;
        if (fVar6 < 0.0) {
          fVar6 = sqrtf(fVar6);
        }
        else {
          fVar6 = SQRT(fVar6);
        }
        fVar11 = log10f((float)iVar1 / 100.0 + 1.0);
        fVar6 = fVar11 * fVar6 * -0.02 + OnRender::s_SpeedBias;
        if (fVar6 <= fVar10) {
          fVar10 = fVar6;
        }
        OnRender::s_SpeedBias =
             (float)(-(uint)(fVar6 < 0.5) & 0x3f000000 | ~-(uint)(fVar6 < 0.5) & (uint)fVar10);
      }
    }
    OnRender::s_LastMousePos = ((this->super_CComponent).m_pClient)->m_pControls->m_MousePos;
    fVar10 = OnRender::s_LastMousePos.field_0.x * OnRender::s_LastMousePos.field_0.x +
             OnRender::s_LastMousePos.field_1.y * OnRender::s_LastMousePos.field_1.y;
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    vVar7.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    vVar7.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    if (0.0001 < fVar10) {
      pCVar2 = (this->super_CComponent).m_pClient;
      pCVar3 = pCVar2->m_pConfig;
      if (pCVar3->m_ClDynamicCamera != 0) {
        fVar10 = fVar10 - (float)pCVar3->m_ClMouseDeadzone;
        if (fVar10 <= 0.0) {
          fVar10 = 0.0;
        }
        fVar10 = fVar10 * ((float)pCVar3->m_ClMouseFollowfactor / 100.0);
        pCVar4 = pCVar2->m_pControls;
        fVar6 = (pCVar4->m_MousePos).field_0.x;
        fVar11 = (pCVar4->m_MousePos).field_1.y;
        fVar6 = fVar6 * fVar6 + fVar11 * fVar11;
        if (fVar6 < 0.0) {
          fVar6 = sqrtf(fVar6);
        }
        else {
          fVar6 = SQRT(fVar6);
        }
        auVar13._8_8_ = 0;
        auVar13._0_4_ = (pCVar4->m_MousePos).field_0;
        auVar13._4_4_ = (pCVar4->m_MousePos).field_1;
        auVar9._4_4_ = fVar6;
        auVar9._0_4_ = fVar6;
        auVar9._8_4_ = fVar6;
        auVar9._12_4_ = fVar6;
        auVar14 = divps(auVar13,auVar9);
        vVar7.field_0.x = fVar10 * auVar14._0_4_;
        vVar7.field_1.y = fVar10 * auVar14._4_4_;
      }
    }
    pCVar2 = (this->super_CComponent).m_pClient;
    if (0 < pCVar2->m_pConfig->m_ClCameraSmoothness) {
      fVar16 = fVar16 * OnRender::s_SpeedBias;
      if (1.0 <= fVar16) {
        fVar16 = 1.0;
      }
      aVar15 = vVar7.field_0;
      vVar7.field_1.y =
           fVar16 * (vVar7.field_1.y - OnRender::s_CurrentCameraOffset.field_1.y) +
           OnRender::s_CurrentCameraOffset.field_1.y;
      vVar7.field_0.x =
           fVar16 * (aVar15.x - OnRender::s_CurrentCameraOffset.field_0.x) +
           OnRender::s_CurrentCameraOffset.field_0.x;
    }
    OnRender::s_CurrentCameraOffset = vVar7;
    if ((pCVar2->m_Snap).m_SpecInfo.m_Active == true) {
      _local_28 = (pCVar2->m_Snap).m_SpecInfo.m_Position;
    }
    else {
      _local_28 = pCVar2->m_LocalCharacterPos;
    }
  }
  else {
    this->m_Zoom = 0.7;
    if (OnRender()::Dir == '\0') {
      OnRender();
    }
    fVar16 = (this->m_Center).field_0.x - (this->m_RotationCenter).field_0.x;
    fVar10 = (this->m_Center).field_1.y - (this->m_RotationCenter).field_1.y;
    fVar16 = fVar16 * fVar16 + fVar10 * fVar10;
    if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    pCVar2 = (this->super_CComponent).m_pClient;
    pCVar3 = pCVar2->m_pConfig;
    if (fVar16 <= (float)pCVar3->m_ClRotationRadius + 0.5) {
      fVar16 = ((360.0 / (float)pCVar3->m_ClRotationSpeed) * pCVar2->m_pClient->m_RenderFrameTime *
               3.1415927) / 180.0;
      fVar10 = sinf(fVar16);
      fVar16 = cosf(fVar16);
      aVar15.x = OnRender::Dir.field_0.x * fVar16 + -fVar10 * OnRender::Dir.field_1.y;
      aVar17.y = OnRender::Dir.field_0.x * fVar10 + fVar16 * OnRender::Dir.field_1.y;
      OnRender::Dir.field_1.y = aVar17.y;
      OnRender::Dir.field_0.x = aVar15.x;
      fVar16 = (float)((this->super_CComponent).m_pClient)->m_pConfig->m_ClRotationRadius;
      vVar7.field_0.x = fVar16 * aVar15.x;
      vVar7.field_1.y = fVar16 * aVar17.y;
      _local_28 = this->m_RotationCenter;
    }
    else {
      auVar14._0_4_ = (this->m_AnimationStartPos).field_0.x - (this->m_RotationCenter).field_0.x;
      auVar14._4_4_ = (this->m_AnimationStartPos).field_1.y - (this->m_RotationCenter).field_1.y;
      auVar14._8_8_ = 0;
      fVar16 = auVar14._0_4_ * auVar14._0_4_ + auVar14._4_4_ * auVar14._4_4_;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      auVar8._4_4_ = fVar16;
      auVar8._0_4_ = fVar16;
      auVar8._8_4_ = fVar16;
      auVar8._12_4_ = fVar16;
      auVar14 = divps(auVar14,auVar8);
      OnRender::Dir = auVar14._0_8_;
      fVar16 = (float)((this->super_CComponent).m_pClient)->m_pConfig->m_ClRotationRadius;
      local_28.x = (this->m_RotationCenter).field_0.x + fVar16 * auVar14._0_4_;
      aStack_24.y = (this->m_RotationCenter).field_1.y + fVar16 * auVar14._4_4_;
      fVar16 = (this->m_AnimationStartPos).field_0.x - local_28.x;
      fVar10 = (this->m_AnimationStartPos).field_1.y - aStack_24.y;
      fVar16 = fVar16 * fVar16 + fVar10 * fVar10;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      pCVar2 = (this->super_CComponent).m_pClient;
      fVar10 = ((float)pCVar2->m_pConfig->m_ClCameraSpeed * pCVar2->m_pClient->m_RenderFrameTime) /
               10.0 + this->m_MoveTime;
      this->m_MoveTime = fVar10;
      fVar10 = powf(1.0 - fVar10,7.0);
      vVar7.field_0.x = fVar10 * fVar16 * OnRender::Dir.field_0.x;
      vVar7.field_1.y = fVar10 * fVar16 * OnRender::Dir.field_1.y;
    }
  }
  vVar12.field_0.x = local_28.x + vVar7.field_0.x;
  vVar12.field_1.y = local_28.y + vVar7.field_1.y;
  this->m_Center = vVar12;
LAB_00136479:
  this->m_PrevCenter = this->m_Center;
  return;
}

Assistant:

void CCamera::OnRender()
{
	if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		m_Zoom = 1.0f;

		// update camera center
		if(m_pClient->m_Snap.m_SpecInfo.m_Active && !m_pClient->m_Snap.m_SpecInfo.m_UsePosition &&
			(m_pClient->m_Snap.m_SpecInfo.m_SpecMode == SPEC_FREEVIEW || (m_pClient->m_Snap.m_pLocalInfo && !(m_pClient->m_Snap.m_pLocalInfo->m_PlayerFlags&PLAYERFLAG_DEAD))))
		{
			if(m_CamType != CAMTYPE_SPEC)
			{
				m_pClient->m_pControls->m_MousePos = m_PrevCenter;
				m_pClient->m_pControls->ClampMousePos();
				m_CamType = CAMTYPE_SPEC;
			}
			m_Center = m_pClient->m_pControls->m_MousePos;
		}
		else
		{
			if(m_CamType != CAMTYPE_PLAYER)
			{
				m_pClient->m_pControls->ClampMousePos();
				m_CamType = CAMTYPE_PLAYER;
			}

			float DeltaTime = Client()->RenderFrameTime();
			static vec2 s_LastMousePos(0, 0);
			static vec2 s_CurrentCameraOffset(0, 0);
			static float s_SpeedBias = 0.5f;

			if(Config()->m_ClCameraSmoothness > 0)
			{
				float CameraSpeed = (1.0f - (Config()->m_ClCameraSmoothness / 100.0f)) * 9.5f + 0.5f;
				float CameraStabilizingFactor = 1 + Config()->m_ClCameraStabilizing / 100.0f;

				s_SpeedBias += CameraSpeed * DeltaTime;
				if(Config()->m_ClDynamicCamera)
				{
					s_SpeedBias -= length(m_pClient->m_pControls->m_MousePos - s_LastMousePos) * log10f(CameraStabilizingFactor) * 0.02f;
					s_SpeedBias = clamp(s_SpeedBias, 0.5f, CameraSpeed);
				}
				else
				{
					s_SpeedBias = maximum(5.0f, CameraSpeed); // make sure toggle back is fast
				}
			}

			vec2 TargetCameraOffset(0, 0);
			s_LastMousePos = m_pClient->m_pControls->m_MousePos;
			float l = length(s_LastMousePos);
			if(Config()->m_ClDynamicCamera && l > 0.0001f) // make sure that this isn't 0
			{
				float DeadZone = Config()->m_ClMouseDeadzone;
				float FollowFactor = Config()->m_ClMouseFollowfactor/100.0f;
				float OffsetAmount = maximum(l-DeadZone, 0.0f) * FollowFactor;

				TargetCameraOffset = normalize(m_pClient->m_pControls->m_MousePos)*OffsetAmount;
			}
			
			if(Config()->m_ClCameraSmoothness > 0)
				s_CurrentCameraOffset += (TargetCameraOffset - s_CurrentCameraOffset) * minimum(DeltaTime * s_SpeedBias, 1.0f);
			else
				s_CurrentCameraOffset = TargetCameraOffset;
			
			if(m_pClient->m_Snap.m_SpecInfo.m_Active)
				m_Center = m_pClient->m_Snap.m_SpecInfo.m_Position + s_CurrentCameraOffset;
			else
				m_Center = m_pClient->m_LocalCharacterPos + s_CurrentCameraOffset;
		}
	}
	else
	{
		m_Zoom = 0.7f;
		static vec2 Dir = vec2(1.0f, 0.0f);

		if(distance(m_Center, m_RotationCenter) <= (float)Config()->m_ClRotationRadius+0.5f)
		{
			// do little rotation
			float RotPerTick = 360.0f/(float)Config()->m_ClRotationSpeed * Client()->RenderFrameTime();
			Dir = rotate(Dir, RotPerTick);
			m_Center = m_RotationCenter+Dir*(float)Config()->m_ClRotationRadius;
		}
		else
		{
			// positions for the animation
			Dir = normalize(m_AnimationStartPos - m_RotationCenter);
			vec2 TargetPos = m_RotationCenter + Dir * (float)Config()->m_ClRotationRadius;
			float Distance = distance(m_AnimationStartPos, TargetPos);

			// move time
			m_MoveTime += Client()->RenderFrameTime()*Config()->m_ClCameraSpeed / 10.0f;
			float XVal = 1 - m_MoveTime;
			XVal = pow(XVal, 7.0f);

			m_Center = TargetPos + Dir * (XVal*Distance);
		}
	}

	m_PrevCenter = m_Center;
}